

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_test.cpp
# Opt level: O2

void __thiscall RotateFromTo_Simple_Test::RotateFromTo_Simple_Test(RotateFromTo_Simple_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_02eeda28;
  return;
}

Assistant:

TEST(RotateFromTo, Simple) {
    {
    // Same directions...
    Vector3f from(0,0,1), to(0, 0, 1);
    Transform r = RotateFromTo(from, to);
    Vector3f toNew = r(from);
    EXPECT_EQ(to, toNew);
    }

    {
    Vector3f from(0,0,1), to(1,0,0);
    Transform r = RotateFromTo(from, to);
    Vector3f toNew = r(from);
    EXPECT_EQ(to, toNew);
    }

    {
    Vector3f from(0,0,1), to(0,1,0);
    Transform r = RotateFromTo(from, to);
    Vector3f toNew = r(from);
    EXPECT_EQ(to, toNew);
    }
}